

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O2

void spot_free(Spot *spot)

{
  uchar i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < spot->cardsCount; uVar1 = uVar1 + 1) {
    card_free(spot->cards[uVar1]);
  }
  free(spot->cards);
  free(spot);
  return;
}

Assistant:

void spot_free(Spot * spot)
{
	unsigned char i;
	for(i=0;i<spot->cardsCount;i++)
	{
		card_free(spot->cards[i]);
	}
	free(spot->cards);
	free(spot);
}